

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cRGB,cBGRA,bModulate>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  EBlend EVar3;
  FSpecialColormap *pFVar4;
  long lVar5;
  int iVar6;
  byte *pbVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  
  pFVar4 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_004e9530_caseD_0:
    if (0 < count) {
      pbVar7 = pin + 2;
      lVar5 = 0;
      do {
        pout[lVar5 * 4 + 2] = (BYTE)(((uint)pout[lVar5 * 4 + 2] * (uint)pbVar7[-2]) / 0xff);
        pout[lVar5 * 4 + 1] = (BYTE)(((uint)pout[lVar5 * 4 + 1] * (uint)pbVar7[-1]) / 0xff);
        pout[lVar5 * 4] = (BYTE)(((uint)pout[lVar5 * 4] * (uint)*pbVar7) / 0xff);
        pout[lVar5 * 4 + 3] = 0xff;
        lVar5 = lVar5 + 1;
        pbVar7 = pbVar7 + step;
      } while (count != (int)lVar5);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_004e9530_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        pbVar7 = pin + 2;
        lVar5 = 0;
        do {
          uVar10 = (uint)pbVar7[-1] * 0x8f + (uint)pbVar7[-2] * 0x4d +
                   ((uint)*pbVar7 + (uint)*pbVar7 * 8) * 4 >> 0xc;
          pout[lVar5 * 4 + 2] =
               (BYTE)(((uint)pout[lVar5 * 4 + 2] * (uint)IcePalette[uVar10][0]) / 0xff);
          pout[lVar5 * 4 + 1] =
               (BYTE)(((uint)pout[lVar5 * 4 + 1] * (uint)IcePalette[uVar10][1]) / 0xff);
          pout[lVar5 * 4] = (BYTE)(((uint)pout[lVar5 * 4] * (uint)IcePalette[uVar10][2]) / 0xff);
          pout[lVar5 * 4 + 3] = 0xff;
          lVar5 = lVar5 + 1;
          pbVar7 = pbVar7 + step;
        } while (count != (int)lVar5);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        pbVar7 = pin + 2;
        lVar5 = 0;
        do {
          iVar8 = inf->blendcolor[3];
          bVar1 = pbVar7[-1];
          iVar6 = inf->blendcolor[1];
          bVar2 = *pbVar7;
          iVar12 = inf->blendcolor[2];
          pout[lVar5 * 4 + 2] =
               (BYTE)(((uint)pout[lVar5 * 4 + 2] *
                      ((uint)pbVar7[-2] * iVar8 + inf->blendcolor[0] >> 0x10 & 0xff)) / 0xff);
          pout[lVar5 * 4 + 1] =
               (BYTE)(((uint)pout[lVar5 * 4 + 1] * ((uint)bVar1 * iVar8 + iVar6 >> 0x10 & 0xff)) /
                     0xff);
          pout[lVar5 * 4] =
               (BYTE)(((uint)pout[lVar5 * 4] * ((uint)bVar2 * iVar8 + iVar12 >> 0x10 & 0xff)) / 0xff
                     );
          pout[lVar5 * 4 + 3] = 0xff;
          lVar5 = lVar5 + 1;
          pbVar7 = pbVar7 + step;
        } while (count != (int)lVar5);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        pbVar7 = pin + 2;
        lVar5 = 0;
        do {
          bVar1 = pbVar7[-1];
          iVar8 = inf->blendcolor[1];
          bVar2 = *pbVar7;
          iVar6 = inf->blendcolor[2];
          pout[lVar5 * 4 + 2] =
               (BYTE)(((uint)pout[lVar5 * 4 + 2] *
                      ((uint)pbVar7[-2] * inf->blendcolor[0] >> 0x10 & 0xff)) / 0xff);
          pout[lVar5 * 4 + 1] =
               (BYTE)(((uint)pout[lVar5 * 4 + 1] * ((uint)bVar1 * iVar8 >> 0x10 & 0xff)) / 0xff);
          pout[lVar5 * 4] =
               (BYTE)(((uint)pout[lVar5 * 4] * ((uint)bVar2 * iVar6 >> 0x10 & 0xff)) / 0xff);
          pout[lVar5 * 4 + 3] = 0xff;
          lVar5 = lVar5 + 1;
          pbVar7 = pbVar7 + step;
        } while (count != (int)lVar5);
      }
      break;
    default:
      EVar3 = inf->blend;
      lVar5 = (long)EVar3;
      if (lVar5 < 0x21) {
        if ((BLEND_ICEMAP < EVar3) && (0 < count)) {
          iVar8 = 0x20 - EVar3;
          pbVar7 = pin + 2;
          lVar5 = 0;
          do {
            bVar1 = *pbVar7;
            iVar6 = ((uint)pbVar7[-1] * 0x8f + (uint)pbVar7[-2] * 0x4d +
                     ((uint)bVar1 + (uint)bVar1 * 8) * 4 >> 8) * (EVar3 + BLEND_MODULATE);
            iVar12 = (uint)pbVar7[-2] * iVar8 + iVar6;
            iVar13 = (uint)pbVar7[-1] * iVar8 + iVar6;
            iVar6 = (uint)bVar1 * iVar8 + iVar6;
            pout[lVar5 * 4 + 2] =
                 (BYTE)(((uint)pout[lVar5 * 4 + 2] *
                        ((uint)((ulong)((long)iVar12 * 0x84210843) >> 0x24) - (iVar12 >> 0x1f) &
                        0xff)) / 0xff);
            pout[lVar5 * 4 + 1] =
                 (BYTE)(((uint)pout[lVar5 * 4 + 1] *
                        ((uint)((ulong)((long)iVar13 * 0x84210843) >> 0x24) - (iVar13 >> 0x1f) &
                        0xff)) / 0xff);
            pout[lVar5 * 4] =
                 (BYTE)(((uint)pout[lVar5 * 4] *
                        ((uint)((ulong)((long)iVar6 * 0x84210843) >> 0x24) - (iVar6 >> 0x1f) & 0xff)
                        ) / 0xff);
            pout[lVar5 * 4 + 3] = 0xff;
            lVar5 = lVar5 + 1;
            pbVar7 = pbVar7 + step;
          } while (count != (int)lVar5);
        }
      }
      else if (0 < count) {
        pbVar7 = pin + 2;
        lVar9 = 0;
        do {
          uVar11 = (ulong)((uint)pbVar7[-1] * 0x8f + (uint)pbVar7[-2] * 0x4d +
                           ((uint)*pbVar7 + (uint)*pbVar7 * 8) * 4 >> 8);
          bVar1 = *(byte *)((long)pFVar4 + uVar11 * 4 + lVar5 * 0x518 + -0xa700);
          bVar2 = *(byte *)((long)pFVar4 + uVar11 * 4 + lVar5 * 0x518 + -0xa6ff);
          pout[lVar9 * 4 + 2] =
               (BYTE)(((uint)pout[lVar9 * 4 + 2] *
                      (uint)*(byte *)((long)pFVar4 + uVar11 * 4 + lVar5 * 0x518 + -0xa6fe)) / 0xff);
          pout[lVar9 * 4 + 1] = (BYTE)(((uint)pout[lVar9 * 4 + 1] * (uint)bVar2) / 0xff);
          pout[lVar9 * 4] = (BYTE)(((uint)pout[lVar9 * 4] * (uint)bVar1) / 0xff);
          pout[lVar9 * 4 + 3] = 0xff;
          lVar9 = lVar9 + 1;
          pbVar7 = pbVar7 + step;
        } while (count != (int)lVar9);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}